

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

VariableData *
CreateFunctionContextVariable
          (ExpressionContext *ctx,SynBase *source,FunctionData *function,FunctionData *prototype)

{
  uint uniqueId;
  TypeBase *type;
  TypeStruct *type_00;
  uint uVar1;
  uint offset;
  int iVar2;
  undefined4 extraout_var;
  VariableData *pVVar3;
  InplaceStr IVar4;
  SynIdentifier *name;
  undefined4 extraout_var_00;
  
  if (function->scope->ownerType == (TypeBase *)0x0) {
    type = function->contextType;
    if ((type == (TypeBase *)0x0) || (type->typeID != 0x12)) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x21e3,
                    "VariableData *CreateFunctionContextVariable(ExpressionContext &, SynBase *, FunctionData *, FunctionData *)"
                   );
    }
    type_00 = (TypeStruct *)type[1]._vptr_TypeBase;
    if ((type_00 == (TypeStruct *)0x0) || ((type_00->super_TypeBase).typeID != 0x18)) {
      __assert_fail("classType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x21e7,
                    "VariableData *CreateFunctionContextVariable(ExpressionContext &, SynBase *, FunctionData *, FunctionData *)"
                   );
    }
    anon_unknown.dwarf_1117a3::FinalizeAlignment(type_00);
    if ((type_00->members).head != (MemberHandle *)0x0) {
      if (prototype != (FunctionData *)0x0) {
        pVVar3 = (VariableData *)prototype->declaration[2].source;
        pVVar3->isAlloca = false;
        uVar1 = anon_unknown.dwarf_1117a3::AllocateVariableInScope(ctx,source,type->alignment,type);
        pVVar3->offset = uVar1;
        return pVVar3;
      }
      offset = anon_unknown.dwarf_1117a3::AllocateVariableInScope(ctx,source,type->alignment,type);
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      name = (SynIdentifier *)CONCAT44(extraout_var,iVar2);
      IVar4 = GetFunctionContextVariableName(ctx,function,function->functionIndex);
      (name->super_SynBase).typeID = 4;
      (name->super_SynBase).begin = (Lexeme *)0x0;
      (name->super_SynBase).end = (Lexeme *)0x0;
      (name->super_SynBase).pos.begin = (char *)0x0;
      (name->super_SynBase).pos.end = (char *)0x0;
      *(undefined8 *)((long)&(name->super_SynBase).pos.end + 2) = 0;
      *(undefined8 *)((long)&(name->super_SynBase).next + 2) = 0;
      (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
      name->name = IVar4;
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
      pVVar3 = (VariableData *)CONCAT44(extraout_var_00,iVar2);
      uVar1 = type->alignment;
      uniqueId = ctx->uniqueVariableId;
      ctx->uniqueVariableId = uniqueId + 1;
      VariableData::VariableData
                (pVVar3,ctx->allocator,source,ctx->scope,uVar1,type,name,offset,uniqueId);
      ExpressionContext::AddVariable(ctx,pVVar3,true);
      return pVVar3;
    }
  }
  return (VariableData *)0x0;
}

Assistant:

VariableData* CreateFunctionContextVariable(ExpressionContext &ctx, SynBase *source, FunctionData *function, FunctionData *prototype)
{
	if(function->scope->ownerType)
		return NULL;

	TypeRef *refType = getType<TypeRef>(function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	FinalizeAlignment(classType);

	if(classType->members.empty())
		return NULL;

	VariableData *context = NULL;

	if(prototype)
	{
		ExprFunctionDefinition *definition = getType<ExprFunctionDefinition>(prototype->declaration);

		context = definition->contextVariable;

		context->isAlloca = false;
		context->offset = AllocateVariableInScope(ctx, source, refType->alignment, refType);
	}
	else
	{
		// Create a variable holding a reference to a closure
		unsigned offset = AllocateVariableInScope(ctx, source, refType->alignment, refType);

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(GetFunctionContextVariableName(ctx, function, ctx.GetFunctionIndex(function)));

		context = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, refType->alignment, refType, nameIdentifier, offset, ctx.uniqueVariableId++);

		ctx.AddVariable(context, true);
	}

	return context;
}